

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O3

AbstractSearchState * __thiscall CIntHeap::deleteminheap(CIntHeap *this)

{
  int iVar1;
  heapintelement *phVar2;
  AbstractSearchState *pAVar3;
  long lVar4;
  heapintelement tmp;
  
  iVar1 = this->currentsize;
  lVar4 = (long)iVar1;
  if (lVar4 != 0) {
    phVar2 = this->heap;
    pAVar3 = phVar2[1].heapstate;
    pAVar3->heapindex = 0;
    this->currentsize = iVar1 + -1;
    tmp.key = phVar2[lVar4].key;
    tmp.heapstate = phVar2[lVar4].heapstate;
    tmp._12_4_ = 0;
    percolatedown(this,1,tmp);
    return pAVar3;
  }
  heaperror("DeleteMin: heap is empty");
}

Assistant:

AbstractSearchState* CIntHeap::deleteminheap()
{
    AbstractSearchState *AbstractSearchState;

    if (currentsize == 0) heaperror("DeleteMin: heap is empty");

    AbstractSearchState = heap[1].heapstate;
    AbstractSearchState->heapindex = 0;
    percolatedown(1, heap[currentsize--]);
    return AbstractSearchState;
}